

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::NamedParamAssignmentSyntax::getChild(NamedParamAssignmentSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff88;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
    break;
  case 1:
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
    break;
  case 2:
    token_01.info = in_RSI;
    token_01._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_01);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffff88);
    break;
  case 4:
    token_02.info = in_RSI;
    token_02._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax NamedParamAssignmentSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return dot;
        case 1: return name;
        case 2: return openParen;
        case 3: return expr;
        case 4: return closeParen;
        default: return nullptr;
    }
}